

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Stack::dump(Stack *this)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  LocationRange *in_stack_ffffffffffffffc8;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ::size((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                    *)(in_RDI + 0x10));
    if (sVar1 <= local_10) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"stack[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"] = ");
    std::
    vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  *)(in_RDI + 0x10),local_10);
    poVar2 = internal::operator<<(poVar2,in_stack_ffffffffffffffc8);
    poVar2 = std::operator<<(poVar2," (");
    pvVar3 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           *)(in_RDI + 0x10),local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->kind);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_10 = local_10 + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void dump(void)
    {
        for (std::size_t i = 0; i < stack.size(); ++i) {
            std::cout << "stack[" << i << "] = " << stack[i].location << " (" << stack[i].kind
                      << ")" << std::endl;
        }
        std::cout << std::endl;
    }